

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

bool __thiscall
wasm::PrintExpressionContents::printUnreachableOrNullReplacement
          (PrintExpressionContents *this,Expression *curr)

{
  bool bVar1;
  
  if (((curr->type).id != 1) && (bVar1 = wasm::Type::isNull(&curr->type), !bVar1)) {
    return false;
  }
  printMedium(this->o,"block");
  return true;
}

Assistant:

bool printUnreachableOrNullReplacement(Expression* curr) {
    if (curr->type == Type::unreachable || curr->type.isNull()) {
      printMedium(o, "block");
      return true;
    }
    return false;
  }